

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264.c
# Opt level: O0

int h264_vui_parameters(bitstream *str,h264_vui *vui)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  uint uVar6;
  void *pvVar7;
  bitstream *in_RSI;
  int *in_RDI;
  uint32_t tmp;
  uint32_t in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  int local_4;
  
  iVar5 = vs_u(in_RSI,(uint32_t *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
               in_stack_ffffffffffffffdc);
  if (iVar5 != 0) {
    return 1;
  }
  if (in_RSI->dir == VS_ENCODE) {
    iVar5 = vs_infer(in_RSI,(uint32_t *)
                            CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                     in_stack_ffffffffffffffdc);
    if (iVar5 != 0) {
      return 1;
    }
    iVar5 = vs_infer(in_RSI,(uint32_t *)
                            CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                     in_stack_ffffffffffffffdc);
    if (iVar5 != 0) {
      return 1;
    }
    iVar5 = vs_infer(in_RSI,(uint32_t *)
                            CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                     in_stack_ffffffffffffffdc);
    if (iVar5 != 0) {
      return 1;
    }
  }
  else {
    iVar5 = vs_u(in_RSI,(uint32_t *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                 in_stack_ffffffffffffffdc);
    if (iVar5 != 0) {
      return 1;
    }
    if (*(int *)&in_RSI->field_0x4 == 0xff) {
      iVar5 = vs_u(in_RSI,(uint32_t *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                   in_stack_ffffffffffffffdc);
      if (iVar5 != 0) {
        return 1;
      }
      iVar5 = vs_u(in_RSI,(uint32_t *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                   in_stack_ffffffffffffffdc);
      if (iVar5 != 0) {
        return 1;
      }
    }
    else if (*(uint *)&in_RSI->field_0x4 < 0x11) {
      iVar5 = vs_infer(in_RSI,(uint32_t *)
                              CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                       in_stack_ffffffffffffffdc);
      if (iVar5 != 0) {
        return 1;
      }
      iVar5 = vs_infer(in_RSI,(uint32_t *)
                              CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                       in_stack_ffffffffffffffdc);
      if (iVar5 != 0) {
        return 1;
      }
    }
    else {
      fprintf(_stderr,"WARNING: unknown aspect_ratio_idc %d\n",(ulong)*(uint *)&in_RSI->field_0x4);
      iVar5 = vs_infer(in_RSI,(uint32_t *)
                              CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                       in_stack_ffffffffffffffdc);
      if (iVar5 != 0) {
        return 1;
      }
      iVar5 = vs_infer(in_RSI,(uint32_t *)
                              CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                       in_stack_ffffffffffffffdc);
      if (iVar5 != 0) {
        return 1;
      }
    }
  }
  iVar5 = vs_u(in_RSI,(uint32_t *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
               in_stack_ffffffffffffffdc);
  if (iVar5 == 0) {
    if ((in_RSI->bytesnum == 0) ||
       (iVar5 = vs_u(in_RSI,(uint32_t *)
                            CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                     in_stack_ffffffffffffffdc), iVar5 == 0)) {
      iVar5 = vs_u(in_RSI,(uint32_t *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                   in_stack_ffffffffffffffdc);
      if (iVar5 == 0) {
        if (*(int *)&in_RSI->curbyte == 0) {
          iVar5 = vs_infer(in_RSI,(uint32_t *)
                                  CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                           in_stack_ffffffffffffffdc);
          if (iVar5 != 0) {
            return 1;
          }
          iVar5 = vs_infer(in_RSI,(uint32_t *)
                                  CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                           in_stack_ffffffffffffffdc);
          if (iVar5 != 0) {
            return 1;
          }
          iVar5 = vs_infer(in_RSI,(uint32_t *)
                                  CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                           in_stack_ffffffffffffffdc);
          if (iVar5 != 0) {
            return 1;
          }
        }
        else {
          iVar5 = vs_u(in_RSI,(uint32_t *)
                              CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                       in_stack_ffffffffffffffdc);
          if (iVar5 != 0) {
            return 1;
          }
          iVar5 = vs_u(in_RSI,(uint32_t *)
                              CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                       in_stack_ffffffffffffffdc);
          if (iVar5 != 0) {
            return 1;
          }
          iVar5 = vs_u(in_RSI,(uint32_t *)
                              CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                       in_stack_ffffffffffffffdc);
          if (iVar5 != 0) {
            return 1;
          }
        }
        if (in_RSI->zero_bytes == 0) {
          iVar5 = vs_infer(in_RSI,(uint32_t *)
                                  CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                           in_stack_ffffffffffffffdc);
          if (iVar5 != 0) {
            return 1;
          }
          iVar5 = vs_infer(in_RSI,(uint32_t *)
                                  CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                           in_stack_ffffffffffffffdc);
          if (iVar5 != 0) {
            return 1;
          }
          iVar5 = vs_infer(in_RSI,(uint32_t *)
                                  CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                           in_stack_ffffffffffffffdc);
          if (iVar5 != 0) {
            return 1;
          }
        }
        else {
          iVar5 = vs_u(in_RSI,(uint32_t *)
                              CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                       in_stack_ffffffffffffffdc);
          if (iVar5 != 0) {
            return 1;
          }
          iVar5 = vs_u(in_RSI,(uint32_t *)
                              CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                       in_stack_ffffffffffffffdc);
          if (iVar5 != 0) {
            return 1;
          }
          iVar5 = vs_u(in_RSI,(uint32_t *)
                              CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                       in_stack_ffffffffffffffdc);
          if (iVar5 != 0) {
            return 1;
          }
        }
        iVar5 = vs_u(in_RSI,(uint32_t *)
                            CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                     in_stack_ffffffffffffffdc);
        if (iVar5 == 0) {
          if (*(int *)&in_RSI->field_0x34 == 0) {
            iVar5 = vs_infer(in_RSI,(uint32_t *)
                                    CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                             in_stack_ffffffffffffffdc);
            if (iVar5 != 0) {
              return 1;
            }
            iVar5 = vs_infer(in_RSI,(uint32_t *)
                                    CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                             in_stack_ffffffffffffffdc);
            if (iVar5 != 0) {
              return 1;
            }
          }
          else {
            iVar5 = vs_ue(in_RSI,(uint32_t *)
                                 CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
            if (iVar5 != 0) {
              return 1;
            }
            iVar5 = vs_ue(in_RSI,(uint32_t *)
                                 CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
            if (iVar5 != 0) {
              return 1;
            }
          }
          iVar5 = vs_u(in_RSI,(uint32_t *)
                              CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                       in_stack_ffffffffffffffdc);
          if (iVar5 == 0) {
            if (*(int *)&in_RSI[1].bytes == 0) {
              iVar5 = vs_infer(in_RSI,(uint32_t *)
                                      CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                               in_stack_ffffffffffffffdc);
              if (iVar5 != 0) {
                return 1;
              }
            }
            else {
              iVar5 = vs_u(in_RSI,(uint32_t *)
                                  CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                           in_stack_ffffffffffffffdc);
              if (iVar5 != 0) {
                return 1;
              }
              iVar5 = vs_u(in_RSI,(uint32_t *)
                                  CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                           in_stack_ffffffffffffffdc);
              if (iVar5 != 0) {
                return 1;
              }
              iVar5 = vs_u(in_RSI,(uint32_t *)
                                  CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                           in_stack_ffffffffffffffdc);
              if (iVar5 != 0) {
                return 1;
              }
            }
            lVar1._0_1_ = in_RSI[1].curbyte;
            lVar1._1_3_ = *(undefined3 *)&in_RSI[1].field_0x19;
            lVar1._4_4_ = in_RSI[1].bitpos;
            uVar6 = (uint)(lVar1 != 0);
            iVar5 = vs_u(in_RSI,(uint32_t *)(ulong)CONCAT14(lVar1 != 0,in_stack_ffffffffffffffe0),
                         in_stack_ffffffffffffffdc);
            if (iVar5 == 0) {
              if (uVar6 != 0) {
                if (*in_RDI == 1) {
                  pvVar7 = calloc(0x19c,1);
                  *(void **)&in_RSI[1].curbyte = pvVar7;
                }
                iVar5 = h264_hrd_parameters(in_RSI,(h264_hrd_parameters *)
                                                   CONCAT44(uVar6,in_stack_ffffffffffffffe0));
                if (iVar5 != 0) {
                  return 1;
                }
              }
              lVar2._0_4_ = in_RSI[1].bytepos;
              lVar2._4_4_ = in_RSI[1].zero_bytes;
              uVar6 = (uint)(lVar2 != 0);
              iVar5 = vs_u(in_RSI,(uint32_t *)(ulong)CONCAT14(lVar2 != 0,in_stack_ffffffffffffffe0),
                           in_stack_ffffffffffffffdc);
              if (iVar5 == 0) {
                if (uVar6 != 0) {
                  if (*in_RDI == 1) {
                    pvVar7 = calloc(0x19c,1);
                    *(void **)&in_RSI[1].bytepos = pvVar7;
                  }
                  iVar5 = h264_hrd_parameters(in_RSI,(h264_hrd_parameters *)
                                                     CONCAT44(uVar6,in_stack_ffffffffffffffe0));
                  if (iVar5 != 0) {
                    return 1;
                  }
                }
                lVar3._0_1_ = in_RSI[1].curbyte;
                lVar3._1_3_ = *(undefined3 *)&in_RSI[1].field_0x19;
                lVar3._4_4_ = in_RSI[1].bitpos;
                if (((lVar3 == 0) &&
                    (lVar4._0_4_ = in_RSI[1].bytepos, lVar4._4_4_ = in_RSI[1].zero_bytes, lVar4 == 0
                    )) || (iVar5 = vs_u(in_RSI,(uint32_t *)CONCAT44(uVar6,in_stack_ffffffffffffffe0)
                                        ,in_stack_ffffffffffffffdc), iVar5 == 0)) {
                  iVar5 = vs_u(in_RSI,(uint32_t *)CONCAT44(uVar6,in_stack_ffffffffffffffe0),
                               in_stack_ffffffffffffffdc);
                  if (iVar5 == 0) {
                    iVar5 = vs_u(in_RSI,(uint32_t *)CONCAT44(uVar6,in_stack_ffffffffffffffe0),
                                 in_stack_ffffffffffffffdc);
                    if (iVar5 == 0) {
                      if (in_RSI[1].hasbyte == 0) {
                        iVar5 = vs_infer(in_RSI,(uint32_t *)
                                                CONCAT44(uVar6,in_stack_ffffffffffffffe0),
                                         in_stack_ffffffffffffffdc);
                        if (iVar5 != 0) {
                          return 1;
                        }
                        iVar5 = vs_infer(in_RSI,(uint32_t *)
                                                CONCAT44(uVar6,in_stack_ffffffffffffffe0),
                                         in_stack_ffffffffffffffdc);
                        if (iVar5 != 0) {
                          return 1;
                        }
                        iVar5 = vs_infer(in_RSI,(uint32_t *)
                                                CONCAT44(uVar6,in_stack_ffffffffffffffe0),
                                         in_stack_ffffffffffffffdc);
                        if (iVar5 != 0) {
                          return 1;
                        }
                        iVar5 = vs_infer(in_RSI,(uint32_t *)
                                                CONCAT44(uVar6,in_stack_ffffffffffffffe0),
                                         in_stack_ffffffffffffffdc);
                        if (iVar5 != 0) {
                          return 1;
                        }
                        iVar5 = vs_infer(in_RSI,(uint32_t *)
                                                CONCAT44(uVar6,in_stack_ffffffffffffffe0),
                                         in_stack_ffffffffffffffdc);
                        if (iVar5 != 0) {
                          return 1;
                        }
                        iVar5 = vs_infer(in_RSI,(uint32_t *)
                                                CONCAT44(uVar6,in_stack_ffffffffffffffe0),
                                         in_stack_ffffffffffffffdc);
                        if (iVar5 != 0) {
                          return 1;
                        }
                        iVar5 = vs_infer(in_RSI,(uint32_t *)
                                                CONCAT44(uVar6,in_stack_ffffffffffffffe0),
                                         in_stack_ffffffffffffffdc);
                        if (iVar5 != 0) {
                          return 1;
                        }
                      }
                      else {
                        iVar5 = vs_u(in_RSI,(uint32_t *)CONCAT44(uVar6,in_stack_ffffffffffffffe0),
                                     in_stack_ffffffffffffffdc);
                        if (iVar5 != 0) {
                          return 1;
                        }
                        iVar5 = vs_ue(in_RSI,(uint32_t *)CONCAT44(uVar6,in_stack_ffffffffffffffe0));
                        if (iVar5 != 0) {
                          return 1;
                        }
                        iVar5 = vs_ue(in_RSI,(uint32_t *)CONCAT44(uVar6,in_stack_ffffffffffffffe0));
                        if (iVar5 != 0) {
                          return 1;
                        }
                        iVar5 = vs_ue(in_RSI,(uint32_t *)CONCAT44(uVar6,in_stack_ffffffffffffffe0));
                        if (iVar5 != 0) {
                          return 1;
                        }
                        iVar5 = vs_ue(in_RSI,(uint32_t *)CONCAT44(uVar6,in_stack_ffffffffffffffe0));
                        if (iVar5 != 0) {
                          return 1;
                        }
                        iVar5 = vs_ue(in_RSI,(uint32_t *)CONCAT44(uVar6,in_stack_ffffffffffffffe0));
                        if (iVar5 != 0) {
                          return 1;
                        }
                        iVar5 = vs_ue(in_RSI,(uint32_t *)CONCAT44(uVar6,in_stack_ffffffffffffffe0));
                        if (iVar5 != 0) {
                          return 1;
                        }
                      }
                      local_4 = 0;
                    }
                    else {
                      local_4 = 1;
                    }
                  }
                  else {
                    local_4 = 1;
                  }
                }
                else {
                  local_4 = 1;
                }
              }
              else {
                local_4 = 1;
              }
            }
            else {
              local_4 = 1;
            }
          }
          else {
            local_4 = 1;
          }
        }
        else {
          local_4 = 1;
        }
      }
      else {
        local_4 = 1;
      }
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int h264_vui_parameters(struct bitstream *str, struct h264_vui *vui) {
	if (vs_u(str, &vui->aspect_ratio_present_flag, 1)) return 1;
	if (vui->aspect_ratio_present_flag) {
		if (vs_u(str, &vui->aspect_ratio_idc, 8)) return 1;
		if (vui->aspect_ratio_idc == 255) {
			if (vs_u(str, &vui->sar_width, 16)) return 1;
			if (vs_u(str, &vui->sar_height, 16)) return 1;
		} else {
			if (vui->aspect_ratio_idc < ARRAY_SIZE(aspect_ratios)) {
				if (vs_infer(str, &vui->sar_width, aspect_ratios[vui->aspect_ratio_idc][0])) return 1;
				if (vs_infer(str, &vui->sar_width, aspect_ratios[vui->aspect_ratio_idc][1])) return 1;
			} else {
				fprintf(stderr, "WARNING: unknown aspect_ratio_idc %d\n", vui->aspect_ratio_idc);
				if (vs_infer(str, &vui->sar_width, 0)) return 1;
				if (vs_infer(str, &vui->sar_width, 0)) return 1;
			}
		}
	} else {
		if (vs_infer(str, &vui->aspect_ratio_idc, 0)) return 1;
		if (vs_infer(str, &vui->sar_width, 0)) return 1;
		if (vs_infer(str, &vui->sar_width, 0)) return 1;
	}
	if (vs_u(str, &vui->overscan_info_present_flag, 1)) return 1;
	if (vui->overscan_info_present_flag) {
		if (vs_u(str, &vui->overscan_appropriate_flag, 1)) return 1;
	}
	if (vs_u(str, &vui->video_signal_type_present_flag, 1)) return 1;
	if (vui->video_signal_type_present_flag) {
		if (vs_u(str, &vui->video_format, 3)) return 1;
		if (vs_u(str, &vui->video_full_range_flag, 1)) return 1;
		if (vs_u(str, &vui->colour_description_present_flag, 1)) return 1;
	} else {
		if (vs_infer(str, &vui->video_format, 5)) return 1;
		if (vs_infer(str, &vui->video_full_range_flag, 0)) return 1;
		if (vs_infer(str, &vui->colour_description_present_flag, 0)) return 1;
	}
	if (vui->colour_description_present_flag) {
		if (vs_u(str, &vui->colour_primaries, 8)) return 1;
		if (vs_u(str, &vui->transfer_characteristics, 8)) return 1;
		if (vs_u(str, &vui->matrix_coefficients, 8)) return 1;
	} else {
		if (vs_infer(str, &vui->colour_primaries, 2)) return 1;
		if (vs_infer(str, &vui->transfer_characteristics, 2)) return 1;
		if (vs_infer(str, &vui->matrix_coefficients, 2)) return 1;
	}
	if (vs_u(str, &vui->chroma_loc_info_present_flag, 1)) return 1;
	if (vui->chroma_loc_info_present_flag) {
		if (vs_ue(str, &vui->chroma_sample_loc_type_top_field)) return 1;
		if (vs_ue(str, &vui->chroma_sample_loc_type_bottom_field)) return 1;
	} else {
		if (vs_infer(str, &vui->chroma_sample_loc_type_top_field, 0)) return 1;
		if (vs_infer(str, &vui->chroma_sample_loc_type_bottom_field, 0)) return 1;
	}
	if (vs_u(str, &vui->timing_info_present_flag, 1)) return 1;
	if (vui->timing_info_present_flag) {
		if (vs_u(str, &vui->num_units_in_tick, 32)) return 1;
		if (vs_u(str, &vui->time_scale, 32)) return 1;
		if (vs_u(str, &vui->fixed_frame_rate_flag, 1)) return 1;
	} else {
		if (vs_infer(str, &vui->fixed_frame_rate_flag, 0)) return 1;
	}
	uint32_t tmp;
	tmp = !!vui->nal_hrd_parameters;
	if (vs_u(str, &tmp, 1)) return 1;
	if (tmp) {
		if (str->dir == VS_DECODE)
			vui->nal_hrd_parameters = calloc(sizeof *vui->nal_hrd_parameters, 1);
		if (h264_hrd_parameters(str, vui->nal_hrd_parameters)) return 1;
	}
	tmp = !!vui->vcl_hrd_parameters;
	if (vs_u(str, &tmp, 1)) return 1;
	if (tmp) {
		if (str->dir == VS_DECODE)
			vui->vcl_hrd_parameters = calloc(sizeof *vui->vcl_hrd_parameters, 1);
		if (h264_hrd_parameters(str, vui->vcl_hrd_parameters)) return 1;
	}
	if (vui->nal_hrd_parameters || vui->vcl_hrd_parameters) {
		if (vs_u(str, &vui->low_delay_hrd_flag, 1)) return 1;
	}
	if (vs_u(str, &vui->pic_struct_present_flag, 1)) return 1;
	if (vs_u(str, &vui->bitstream_restriction_present_flag, 1)) return 1;
	if (vui->bitstream_restriction_present_flag) {
		if (vs_u(str, &vui->motion_vectors_over_pic_bounduaries_flag, 1)) return 1;
		if (vs_ue(str, &vui->max_bytes_per_pic_denom)) return 1;
		if (vs_ue(str, &vui->max_bits_per_mb_denom)) return 1;
		if (vs_ue(str, &vui->log2_max_mv_length_horizontal)) return 1;
		if (vs_ue(str, &vui->log2_max_mv_length_vertical)) return 1;
		if (vs_ue(str, &vui->num_reorder_frames)) return 1;
		if (vs_ue(str, &vui->max_dec_frame_buffering)) return 1;
	} else {
		if (vs_infer(str, &vui->motion_vectors_over_pic_bounduaries_flag, 1)) return 1;
		if (vs_infer(str, &vui->max_bytes_per_pic_denom, 2)) return 1;
		if (vs_infer(str, &vui->max_bits_per_mb_denom, 1)) return 1;
		if (vs_infer(str, &vui->log2_max_mv_length_horizontal, 16)) return 1;
		if (vs_infer(str, &vui->log2_max_mv_length_vertical, 16)) return 1;
		/* XXX: not entirely correct */
		if (vs_infer(str, &vui->num_reorder_frames, 16)) return 1;
		if (vs_infer(str, &vui->max_dec_frame_buffering, 16)) return 1;
	}
	return 0;
}